

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueArg.h
# Opt level: O0

void __thiscall
TCLAP::ValueArg<double>::ValueArg
          (ValueArg<double> *this,string *flag,string *name,string *desc,bool req,double val,
          string *typeDesc,CmdLineInterface *parser,Visitor *v)

{
  undefined8 *in_RDI;
  string *in_R9;
  undefined8 in_XMM0_Qa;
  long *in_stack_00000008;
  bool in_stack_000003c6;
  bool in_stack_000003c7;
  string *in_stack_000003c8;
  string *in_stack_000003d0;
  string *in_stack_000003d8;
  Arg *in_stack_000003e0;
  Visitor *in_stack_000003f0;
  
  Arg::Arg(in_stack_000003e0,in_stack_000003d8,in_stack_000003d0,in_stack_000003c8,in_stack_000003c7
           ,in_stack_000003c6,in_stack_000003f0);
  *in_RDI = &PTR__ValueArg_002065c8;
  in_RDI[0x15] = in_XMM0_Qa;
  in_RDI[0x16] = in_XMM0_Qa;
  std::__cxx11::string::string((string *)(in_RDI + 0x17),in_R9);
  in_RDI[0x1b] = 0;
  (**(code **)(*in_stack_00000008 + 0x18))();
  return;
}

Assistant:

ValueArg<T>::ValueArg(const std::string& flag, 
                      const std::string& name, 
                      const std::string& desc, 
                      bool req, 
                      T val,
                      const std::string& typeDesc,
                      CmdLineInterface& parser,
                      Visitor* v)
: Arg(flag, name, desc, req, true, v),
  _value( val ),
  _default( val ),
  _typeDesc( typeDesc ),
  _constraint( NULL )
{ 
    parser.add( this );
}